

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  char cVar1;
  float *pfVar2;
  int *piVar3;
  char *pcVar4;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  int i_6;
  char *ptr_4;
  int *intptr_4;
  int q_1;
  int i_5;
  float bias_2;
  char *ptr_3;
  int *intptr_3;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_1;
  char *ptr_2;
  int *intptr_2;
  int i_4;
  int j;
  float bias_1;
  char *ptr_1;
  int *intptr_1;
  int i_3;
  int h;
  int w_1;
  int i_2;
  int i_1;
  float bias;
  int i;
  char *ptr;
  int *intptr;
  int w;
  int dims;
  Mat *in_stack_fffffffffffffdc0;
  Mat *in_stack_fffffffffffffdc8;
  float local_21c;
  float local_1f8;
  int local_1e4;
  Mat local_1e0;
  Mat *local_1a0;
  Mat local_198;
  int *local_158;
  int local_14c;
  int local_148;
  float local_144;
  Mat local_140;
  char *local_100;
  Mat local_e8;
  int *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  char *local_88;
  int *local_80;
  int local_74;
  int local_70;
  float local_6c;
  char *local_68;
  int *local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  float local_40;
  int local_3c;
  char *local_38;
  int *local_30;
  int local_28;
  int local_24;
  Mat *local_18;
  Mat *local_10;
  
  local_24 = in_RSI->dims;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (local_24 == 1) {
    local_28 = in_RSI->w;
    local_30 = Mat::operator_cast_to_int_(in_RSI);
    local_38 = Mat::operator_cast_to_signed_char_(local_18);
    if (*(int *)(in_RDI + 0x88) == 0) {
      for (local_48 = 0; local_48 < local_28; local_48 = local_48 + 1) {
        cVar1 = float2int8(SUB84(in_stack_fffffffffffffdc0,0));
        local_38[local_48] = cVar1;
        if (((*(byte *)(in_RDI + 0x90) & 1) != 0) && (local_38[local_48] < '\0')) {
          local_38[local_48] = '\0';
        }
      }
    }
    else if (*(int *)(in_RDI + 0x8c) < 2) {
      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
      local_40 = *pfVar2;
      for (local_44 = 0; local_44 < local_28; local_44 = local_44 + 1) {
        cVar1 = float2int8(SUB84(in_stack_fffffffffffffdc0,0));
        local_38[local_44] = cVar1;
        if (((*(byte *)(in_RDI + 0x90) & 1) != 0) && (local_38[local_44] < '\0')) {
          local_38[local_44] = '\0';
        }
      }
    }
    else {
      for (local_3c = 0; local_3c < local_28; local_3c = local_3c + 1) {
        Mat::operator[]((Mat *)(in_RDI + 0x98),local_3c);
        cVar1 = float2int8(SUB84(in_stack_fffffffffffffdc0,0));
        local_38[local_3c] = cVar1;
        if (((*(byte *)(in_RDI + 0x90) & 1) != 0) && (local_38[local_3c] < '\0')) {
          local_38[local_3c] = '\0';
        }
      }
    }
  }
  if (local_24 == 2) {
    local_4c = local_10->w;
    local_50 = local_10->h;
    if (*(int *)(in_RDI + 0x88) == 0) {
      for (local_74 = 0; local_74 < local_50; local_74 = local_74 + 1) {
        local_80 = Mat::row<int_const>(local_10,local_74);
        local_88 = Mat::row<signed_char>(local_18,local_74);
        for (local_8c = 0; local_8c < local_4c; local_8c = local_8c + 1) {
          cVar1 = float2int8(SUB84(in_stack_fffffffffffffdc0,0));
          local_88[local_8c] = cVar1;
          if (((*(byte *)(in_RDI + 0x90) & 1) != 0) && (local_88[local_8c] < '\0')) {
            local_88[local_8c] = '\0';
          }
        }
      }
    }
    else {
      for (local_54 = 0; local_54 < local_50; local_54 = local_54 + 1) {
        local_60 = Mat::row<int_const>(local_10,local_54);
        local_68 = Mat::row<signed_char>(local_18,local_54);
        if (*(int *)(in_RDI + 0x8c) < 2) {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
          local_1f8 = *pfVar2;
        }
        else {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),local_54);
          local_1f8 = *pfVar2;
        }
        local_6c = local_1f8;
        for (local_70 = 0; local_70 < local_4c; local_70 = local_70 + 1) {
          cVar1 = float2int8(SUB84(in_stack_fffffffffffffdc0,0));
          local_68[local_70] = cVar1;
          if (((*(byte *)(in_RDI + 0x90) & 1) != 0) && (local_68[local_70] < '\0')) {
            local_68[local_70] = '\0';
          }
        }
      }
    }
  }
  if (local_24 == 3) {
    local_90 = local_10->w;
    local_94 = local_10->h;
    local_98 = local_10->c;
    local_9c = local_90 * local_94;
    if (*(int *)(in_RDI + 0x88) == 0) {
      for (local_14c = 0; local_14c < local_98; local_14c = local_14c + 1) {
        Mat::channel(in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
        piVar3 = Mat::operator_cast_to_int_(&local_198);
        Mat::~Mat((Mat *)0x1b4503);
        in_stack_fffffffffffffdc0 = &local_1e0;
        local_158 = piVar3;
        Mat::channel(in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
        in_stack_fffffffffffffdc8 =
             (Mat *)Mat::operator_cast_to_signed_char_(in_stack_fffffffffffffdc0);
        Mat::~Mat((Mat *)0x1b4549);
        local_1a0 = in_stack_fffffffffffffdc8;
        for (local_1e4 = 0; local_1e4 < local_9c; local_1e4 = local_1e4 + 1) {
          cVar1 = float2int8(SUB84(in_stack_fffffffffffffdc0,0));
          *(char *)((long)&local_1a0->data + (long)local_1e4) = cVar1;
          if (((*(byte *)(in_RDI + 0x90) & 1) != 0) &&
             (*(char *)((long)&local_1a0->data + (long)local_1e4) < '\0')) {
            *(char *)((long)&local_1a0->data + (long)local_1e4) = '\0';
          }
        }
      }
    }
    else {
      for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
        Mat::channel(in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
        piVar3 = Mat::operator_cast_to_int_(&local_e8);
        Mat::~Mat((Mat *)0x1b42c2);
        local_a8 = piVar3;
        Mat::channel(in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
        pcVar4 = Mat::operator_cast_to_signed_char_(&local_140);
        Mat::~Mat((Mat *)0x1b430e);
        local_100 = pcVar4;
        if (*(int *)(in_RDI + 0x8c) < 2) {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
          local_21c = *pfVar2;
        }
        else {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x98),local_a0);
          local_21c = *pfVar2;
        }
        local_144 = local_21c;
        for (local_148 = 0; local_148 < local_9c; local_148 = local_148 + 1) {
          cVar1 = float2int8(SUB84(in_stack_fffffffffffffdc0,0));
          local_100[local_148] = cVar1;
          if (((*(byte *)(in_RDI + 0x90) & 1) != 0) && (local_100[local_148] < '\0')) {
            local_100[local_148] = '\0';
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{ 
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        const int* intptr = bottom_blob;
        signed char * ptr = top_blob;

        if (bias_term)
        {
            if (bias_data_size > 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias_data[i]) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
            else
            {
                float bias = bias_data[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                ptr[i] = float2int8(intptr[i] * scale_in * scale_out);
                if (fusion_relu && ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                float bias = bias_data_size > 1 ? bias_data[i] : bias_data[0];

                for (int j=0; j<w; j++)
                {
                    ptr[j] = float2int8(((intptr[j] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[j] < 0)
                        ptr[j] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                for (int j=0; j<w; j++)
                {
                    ptr[j] = float2int8(intptr[j] * scale_in * scale_out);
                    if (fusion_relu && ptr[j] < 0)
                        ptr[j] = 0;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;      

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                float bias = bias_data_size > 1 ? bias_data[q] : bias_data[0];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = float2int8(intptr[i] * scale_in * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }    
    }

    return 0;
}